

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermoParser.cpp
# Opt level: O3

bool __thiscall IO::ThermoParser::setThermoDataFor(ThermoParser *this,Species *species)

{
  pointer pcVar1;
  double dVar2;
  size_type sVar3;
  long *plVar4;
  ulong uVar5;
  int iVar6;
  string *str;
  Thermo *pTVar7;
  ulong __n;
  long lVar8;
  pointer pTVar9;
  ulong uVar10;
  bool bVar11;
  string local_70;
  long *local_50;
  ulong local_48;
  long local_40 [2];
  
  pTVar9 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
      super__Vector_impl_data._M_finish != pTVar9) {
    lVar8 = 0;
    uVar10 = 0;
    do {
      str = Thermo::getSpeciesName_abi_cxx11_
                      ((Thermo *)((long)&(pTVar9->species_name_)._M_dataplus._M_p + lVar8));
      convertToCaps(&local_70,str);
      pcVar1 = (species->name_)._M_dataplus._M_p;
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + (species->name_)._M_string_length);
      uVar5 = local_48;
      plVar4 = local_50;
      sVar3 = local_70._M_string_length;
      __n = local_70._M_string_length;
      if (local_48 < local_70._M_string_length) {
        __n = local_48;
      }
      if ((__n == 0) || (iVar6 = bcmp(local_70._M_dataplus._M_p,local_50,__n), iVar6 == 0)) {
        bVar11 = sVar3 == uVar5;
      }
      else {
        bVar11 = false;
      }
      if (plVar4 != local_40) {
        operator_delete(plVar4,local_40[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (bVar11) {
        pTVar9 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        pTVar7 = Species::thermo(species);
        std::__cxx11::string::_M_assign((string *)pTVar7);
        std::__cxx11::string::_M_assign((string *)&pTVar7->note_);
        std::__cxx11::string::_M_assign((string *)&pTVar7->phase_);
        pTVar7->T_high_ = *(double *)((long)&pTVar9->T_high_ + lVar8);
        dVar2 = *(double *)((long)&pTVar9->T_common_ + lVar8);
        pTVar7->T_low_ = *(double *)((long)&pTVar9->T_low_ + lVar8);
        pTVar7->T_common_ = dVar2;
        std::vector<double,_std::allocator<double>_>::operator=
                  (&pTVar7->al_,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(pTVar9->al_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   + lVar8));
        std::vector<double,_std::allocator<double>_>::operator=
                  (&pTVar7->ah_,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(pTVar9->ah_).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   + lVar8));
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        ::operator=(&(pTVar7->elements_map_)._M_t,
                    (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     *)((long)&(pTVar9->elements_map_)._M_t._M_impl + lVar8));
        return true;
      }
      uVar10 = uVar10 + 1;
      pTVar9 = (this->thermos_).super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar8 = lVar8 + 0xd8;
    } while (uVar10 < (ulong)(((long)(this->thermos_).
                                     super__Vector_base<IO::Thermo,_std::allocator<IO::Thermo>_>.
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar9 >> 3)
                             * -0x7b425ed097b425ed));
  }
  return false;
}

Assistant:

bool IO::ThermoParser::setThermoDataFor(IO::Species& species) {
    for (size_t i = 0; i < thermos_.size(); ++i) {
        if (convertToCaps(thermos_[i].getSpeciesName()).compare(species.name()) == 0) {
            species.thermo() = thermos_[i];
            return true;
        }
    }
    return false;
}